

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * fileContent(string *__return_storage_ptr__,string *filename)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ifstream fs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  size_type *local_268;
  size_type local_260;
  size_type local_258;
  undefined8 uStack_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228 [29];
  undefined8 auStack_140 [36];
  
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter","");
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_248,"/");
  local_288._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p == paVar3) {
    local_288.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_288._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_288,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  local_268 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268 == paVar3) {
    local_258 = paVar3->_M_allocated_capacity;
    uStack_250 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_268 = &local_258;
  }
  else {
    local_258 = paVar3->_M_allocated_capacity;
  }
  local_260 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_228,(string *)&local_268,_S_in);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  uVar1 = *(undefined8 *)((long)auStack_140 + *(long *)(local_228[0] + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffff,0,0xffffffff);
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string fileContent(const std::string & filename)
{
  std::ifstream fs(std::string(RESOURCE_DIR) + "/" + filename);
  std::string source(std::istreambuf_iterator<char>(fs), (std::istreambuf_iterator<char>()));
  return source;
}